

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::isSpecializationOperation(TIntermediate *this,TIntermOperator *node)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  undefined4 extraout_var_02;
  long *plVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  byte bVar6;
  
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x130))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (cVar1 != '\0') {
    if (node->op == EOpConvNumeric) {
      iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar2));
      if (iVar2 - 1U < 3) {
        iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x13])(node);
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))
                                   ((long *)CONCAT44(extraout_var_01,iVar2));
        plVar4 = (long *)(**(code **)(*plVar4 + 0x78))(plVar4);
        plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
        iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
        bVar6 = 1;
        if (iVar2 - 1U < 3) goto LAB_00411606;
      }
    }
    bVar6 = node->op - EOpIndexDirect < 4;
    goto LAB_00411606;
  }
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x14])(node);
  plVar4 = (long *)CONCAT44(extraout_var_02,iVar2);
  if (plVar4 == (long *)0x0) {
LAB_00411557:
    if (node->op == EOpConvNumeric) {
      iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x13])(node);
      plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 400))
                                 ((long *)CONCAT44(extraout_var_03,iVar2));
      plVar4 = (long *)(**(code **)(*plVar4 + 0x78))(plVar4);
      plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
      iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
      iVar3 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_04,iVar3));
      if ((((iVar2 != 0xc) && ((iVar2 - 4U & 0xfffffff9) != 0)) && ((iVar2 - 5U & 0xfffffff9) != 0))
         || (((bVar6 = 1, iVar3 != 0xc && ((iVar3 - 4U & 0xfffffff9) != 0)) &&
             ((iVar3 - 5U & 0xfffffff9) != 0)))) {
        bVar6 = 0;
      }
      if (bVar6 != 0) goto LAB_00411606;
    }
    if (node->op < EOpMethod) {
      bVar6 = (byte)(0x7f179ffe000b00 >> ((byte)node->op & 0x3f));
      goto LAB_00411606;
    }
  }
  else {
    plVar5 = (long *)(**(code **)(*plVar4 + 400))(plVar4);
    plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
    cVar1 = (**(code **)(*plVar5 + 0x130))(plVar5);
    if (cVar1 == '\0') {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x198))(plVar4);
      plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
      cVar1 = (**(code **)(*plVar4 + 0x130))(plVar4);
      if (cVar1 == '\0') goto LAB_00411557;
    }
  }
  bVar6 = 0;
LAB_00411606:
  return (bool)(bVar6 & 1);
}

Assistant:

bool TIntermediate::isSpecializationOperation(const TIntermOperator& node) const
{
    // The operations resulting in floating point are quite limited
    // (However, some floating-point operations result in bool, like ">",
    // so are handled later.)
    if (node.getType().isFloatingDomain()) {
        if (IsOpNumericConv(node.getOp()) &&
            isTypeFloat(node.getType().getBasicType()) &&
            isTypeFloat(node.getAsUnaryNode()->getOperand()->getAsTyped()->getType().getBasicType())) {
            return true;
        }
        switch (node.getOp()) {
        case EOpIndexDirect:
        case EOpIndexIndirect:
        case EOpIndexDirectStruct:
        case EOpVectorSwizzle:
            return true;
        default:
            return false;
        }
    }

    // Check for floating-point arguments
    if (const TIntermBinary* bin = node.getAsBinaryNode())
        if (bin->getLeft() ->getType().isFloatingDomain() ||
            bin->getRight()->getType().isFloatingDomain())
            return false;

    // So, for now, we can assume everything left is non-floating-point...

    if (IsOpNumericConv(node.getOp())) {
        TBasicType srcType = node.getAsUnaryNode()->getOperand()->getAsTyped()->getType().getBasicType();
        TBasicType dstType = node.getType().getBasicType();
        if ((isTypeInt(srcType) || srcType == EbtBool) &&
            (isTypeInt(dstType) || dstType == EbtBool)) {
            return true;
        }
    }

    // Now check for integer/bool-based operations
    switch (node.getOp()) {

    // dereference/swizzle
    case EOpIndexDirect:
    case EOpIndexIndirect:
    case EOpIndexDirectStruct:
    case EOpVectorSwizzle:

    // unary operations
    case EOpNegative:
    case EOpLogicalNot:
    case EOpBitwiseNot:

    // binary operations
    case EOpAdd:
    case EOpSub:
    case EOpMul:
    case EOpVectorTimesScalar:
    case EOpDiv:
    case EOpMod:
    case EOpRightShift:
    case EOpLeftShift:
    case EOpAnd:
    case EOpInclusiveOr:
    case EOpExclusiveOr:
    case EOpLogicalOr:
    case EOpLogicalXor:
    case EOpLogicalAnd:
    case EOpEqual:
    case EOpNotEqual:
    case EOpLessThan:
    case EOpGreaterThan:
    case EOpLessThanEqual:
    case EOpGreaterThanEqual:
        return true;
    default:
        return false;
    }
}